

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

RegexMatcher * __thiscall
icu_63::RegexMatcher::region
          (RegexMatcher *this,int64_t regionStart,int64_t regionLimit,int64_t startIndex,
          UErrorCode *status)

{
  long lVar1;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (regionLimit < regionStart || (regionLimit | regionStart) < 0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    lVar1 = this->fInputLength;
    if (lVar1 < regionStart || lVar1 < regionLimit) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    if (startIndex == -1) {
      this->fRegionStart = 0;
      this->fRegionLimit = lVar1;
      this->fActiveStart = 0;
      this->fActiveLimit = lVar1;
      this->fAnchorStart = 0;
      this->fAnchorLimit = lVar1;
      this->fLookStart = 0;
      this->fLookLimit = lVar1;
    }
    this->fMatchStart = 0;
    this->fMatchEnd = 0;
    this->fLastMatchEnd = -1;
    this->fAppendPosition = 0;
    this->fMatch = '\0';
    this->fHitEnd = '\0';
    this->fRequireEnd = '\0';
    this->fTime = 0;
    this->fTickCounter = 10000;
    this->fRegionStart = regionStart;
    this->fRegionLimit = regionLimit;
    this->fActiveStart = regionStart;
    this->fActiveLimit = regionLimit;
    if (startIndex != -1) {
      if (startIndex < regionStart || regionLimit < startIndex) {
        *status = U_INDEX_OUTOFBOUNDS_ERROR;
      }
      this->fMatchEnd = startIndex;
    }
    if (this->fTransparentBounds == '\0') {
      this->fLookStart = regionStart;
      this->fLookLimit = regionLimit;
    }
    if (this->fAnchoringBounds != '\0') {
      this->fAnchorStart = regionStart;
      this->fAnchorLimit = regionLimit;
      return this;
    }
  }
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::region(int64_t regionStart, int64_t regionLimit, int64_t startIndex, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return *this;
    }

    if (regionStart>regionLimit || regionStart<0 || regionLimit<0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }

    int64_t nativeStart = regionStart;
    int64_t nativeLimit = regionLimit;
    if (nativeStart > fInputLength || nativeLimit > fInputLength) {
      status = U_ILLEGAL_ARGUMENT_ERROR;
    }

    if (startIndex == -1)
      this->reset();
    else
      resetPreserveRegion();

    fRegionStart = nativeStart;
    fRegionLimit = nativeLimit;
    fActiveStart = nativeStart;
    fActiveLimit = nativeLimit;

    if (startIndex != -1) {
      if (startIndex < fActiveStart || startIndex > fActiveLimit) {
          status = U_INDEX_OUTOFBOUNDS_ERROR;
      }
      fMatchEnd = startIndex;
    }

    if (!fTransparentBounds) {
        fLookStart = nativeStart;
        fLookLimit = nativeLimit;
    }
    if (fAnchoringBounds) {
        fAnchorStart = nativeStart;
        fAnchorLimit = nativeLimit;
    }
    return *this;
}